

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_wrapper.cpp
# Opt level: O0

size_t daw::cw_details::anon_unknown_0::write_handler
                 (void *data_ptr,size_t Size,size_t nmemb,void *result)

{
  bad_alloc *anon_var_0;
  length_error *anon_var_0_1;
  string *str_result;
  size_t size;
  void *result_local;
  size_t nmemb_local;
  size_t Size_local;
  void *data_ptr_local;
  
  if (nmemb * Size != 0) {
    std::__cxx11::string::append((char *)result,(ulong)data_ptr);
  }
  return nmemb * Size;
}

Assistant:

std::size_t write_handler( void *data_ptr, std::size_t Size,
			                           std::size_t nmemb, void *result ) noexcept {
				std::size_t const size = nmemb * Size;
				if( size > 0 ) {
					auto &str_result = *reinterpret_cast<std::string *>( result );
					try {
						str_result.append( reinterpret_cast<char const *>( data_ptr ),
						                   size );
					} catch( std::bad_alloc const & ) {
						// Error while appending string and with strong exception guarantee
						return 0;
					} catch( std::length_error const & ) { return 0; }
				}
				return size;
			}